

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_thread.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  uint uVar2;
  pthread_t *__newthread;
  ulong uVar3;
  pthread_t apStack_30 [2];
  
  apStack_30[0] = 0x102242;
  uVar2 = atoi(argv[1]);
  uVar3 = (ulong)uVar2;
  lVar1 = -(uVar3 * 8 + 0xf & 0xfffffffffffffff0);
  __newthread = (pthread_t *)((long)apStack_30 + lVar1 + 8);
  if (0 < (int)uVar2) {
    do {
      *(undefined8 *)((long)apStack_30 + lVar1) = 0x102274;
      pthread_create(__newthread,(pthread_attr_t *)0x0,routine_func,(void *)0x0);
      __newthread = __newthread + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  do {
    *(undefined8 *)((long)apStack_30 + lVar1) = 0x102287;
    sleep(1);
  } while( true );
}

Assistant:

int main(int argc,char *argv[])
{
	int cnt = atoi( argv[1] );

	pthread_t tid[ cnt ];
	for(int i=0;i<cnt;i++)
	{
		pthread_create( tid + i,NULL,routine_func,0);
	}
	for(;;)
	{
		sleep(1);
	}
	
	return 0;
}